

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall jrtplib::RTPSources::SentRTPPacket(RTPSources *this)

{
  bool bVar1;
  bool prevsender;
  RTPSources *this_local;
  
  if (this->owndata != (RTPInternalSourceData *)0x0) {
    bVar1 = RTPSourceData::IsSender(&this->owndata->super_RTPSourceData);
    RTPInternalSourceData::SentRTPPacket(this->owndata);
    if ((!bVar1) && (bVar1 = RTPSourceData::IsSender(&this->owndata->super_RTPSourceData), bVar1)) {
      this->sendercount = this->sendercount + 1;
    }
  }
  return;
}

Assistant:

void RTPSources::SentRTPPacket()
{
	if (owndata == 0)
		return;

	bool prevsender = owndata->IsSender();
	
	owndata->SentRTPPacket();
	if (!prevsender && owndata->IsSender())
		sendercount++;
}